

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_ValidationError_Test::
ParseEditionsTest_ValidationError_Test(ParseEditionsTest_ValidationError_Test *this)

{
  ParseEditionsTest_ValidationError_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseEditionsTest);
  (this->super_ParseEditionsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseEditionsTest_ValidationError_Test_02a11be8;
  return;
}

Assistant:

TEST_F(ParseEditionsTest, ValidationError) {
  ExpectHasValidationErrors(
      R"schema(
        edition = "2023";
        option features.field_presence = IMPLICIT;
        option java_package = "blah";
        message TestMessage {
          string foo = 1 [default = "hello"];
        })schema",
      "5:17: Implicit presence fields can't specify defaults.\n");
}